

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void AdditionHelper<signed_char,_unsigned_int,_7>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *lhs,uint *rhs,char *result)

{
  if ((long)((ulong)*rhs + (long)*lhs) < 0x80) {
    *result = (char)((ulong)*rhs + (long)*lhs);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // 32-bit or less - lhs signed, rhs unsigned
        std::int64_t tmp = (std::int64_t)lhs + (std::int64_t)rhs;

        if( tmp <= std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }